

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_constraint.cpp
# Opt level: O2

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> __thiscall
duckdb::UniqueConstraint::Copy(UniqueConstraint *this)

{
  const_reference pvVar1;
  long in_RSI;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (*(long *)(in_RSI + 0x10) == -1) {
    make_uniq<duckdb::UniqueConstraint,duckdb::vector<std::__cxx11::string,true>const&,bool_const&>
              ((duckdb *)&local_38,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)(in_RSI + 0x18),(bool *)(in_RSI + 0x30));
    local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_38._M_dataplus._M_p;
  }
  else {
    if (*(long *)(in_RSI + 0x18) == *(long *)(in_RSI + 0x20)) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      local_38._M_string_length = 0;
      local_38.field_2._M_local_buf[0] = '\0';
    }
    else {
      pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            *)(in_RSI + 0x18),0);
      ::std::__cxx11::string::string((string *)&local_38,(string *)pvVar1);
    }
    make_uniq<duckdb::UniqueConstraint,duckdb::LogicalIndex_const&,std::__cxx11::string_const,bool_const&>
              ((duckdb *)&local_40,(LogicalIndex *)(in_RSI + 0x10),&local_38,(bool *)(in_RSI + 0x30)
              );
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  (this->super_Constraint)._vptr_Constraint = (_func_int **)local_40;
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
}

Assistant:

unique_ptr<Constraint> UniqueConstraint::Copy() const {
	if (!HasIndex()) {
		return make_uniq<UniqueConstraint>(columns, is_primary_key);
	}

	auto result = make_uniq<UniqueConstraint>(index, columns.empty() ? string() : columns[0], is_primary_key);
	return std::move(result);
}